

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

double __thiscall Json::Value::asDouble(Value *this)

{
  double dVar1;
  double *in_RDI;
  undefined1 auVar2 [16];
  ostringstream oss;
  string *in_stack_fffffffffffffe30;
  string local_1b8 [48];
  ostringstream local_188 [384];
  double local_8;
  
  switch(*(byte *)(in_RDI + 1)) {
  case 0:
    local_8 = 0.0;
    break;
  case 1:
    local_8 = (double)(long)*in_RDI;
    break;
  case 2:
    dVar1 = *in_RDI;
    auVar2._8_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar2._0_8_ = dVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = (auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0);
    break;
  case 3:
    local_8 = *in_RDI;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"Value is not convertible to double.");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(local_1b8);
    abort();
  case 5:
    local_8 = 1.0;
    if (((ulong)*in_RDI & 1) == 0) {
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

double Value::asDouble() const {
  switch (type_) {
  case intValue:
    return static_cast<double>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<double>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return integerToDouble(value_.uint_);
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return value_.real_;
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0 : 0.0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to double.");
}